

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O2

int PHYSFS_stat(char *_fname,PHYSFS_Stat *stat)

{
  DirHandle *h;
  _func_int_void_ptr_char_ptr_PHYSFS_Stat_ptr *p_Var1;
  undefined8 uVar2;
  char *pcVar3;
  char *pcVar4;
  int iVar5;
  uint uVar6;
  PHYSFS_ErrorCode PVar7;
  size_t sVar8;
  void *pvVar9;
  ulong uVar10;
  char **ppcVar11;
  size_t len;
  undefined1 *ptr;
  char *dst;
  DirHandle **ppDVar12;
  ulong uVar13;
  char *local_48;
  char *arcfname;
  void *local_38;
  
  ppcVar11 = &local_48;
  if ((_fname == (char *)0x0) || (stat == (PHYSFS_Stat *)0x0)) {
    PHYSFS_setErrorCode(PHYSFS_ERR_INVALID_ARGUMENT);
  }
  else {
    *(undefined4 *)&stat->createtime = 0xffffffff;
    *(undefined4 *)((long)&stat->createtime + 4) = 0xffffffff;
    *(undefined4 *)&stat->accesstime = 0xffffffff;
    *(undefined4 *)((long)&stat->accesstime + 4) = 0xffffffff;
    *(undefined4 *)&stat->filesize = 0xffffffff;
    *(undefined4 *)((long)&stat->filesize + 4) = 0xffffffff;
    *(undefined4 *)&stat->modtime = 0xffffffff;
    *(undefined4 *)((long)&stat->modtime + 4) = 0xffffffff;
    stat->filetype = PHYSFS_FILETYPE_OTHER;
    stat->readonly = 1;
    __PHYSFS_platformGrabMutex(stateLock);
    sVar8 = strlen(_fname);
    len = longest_root + sVar8 + 1;
    if (len < 0x100) {
      ppcVar11 = (char **)((long)&local_48 - (longest_root + sVar8 + 0x18 & 0xfffffffffffffff0));
      ptr = (undefined1 *)ppcVar11;
    }
    else {
      ptr = (undefined1 *)0x0;
    }
    *(undefined8 *)((long)ppcVar11 + -8) = 0x108ef2;
    pvVar9 = __PHYSFS_initSmallAlloc(ptr,len);
    if (pvVar9 != (void *)0x0) {
      dst = (char *)(longest_root + (long)pvVar9);
      *(undefined8 *)((long)ppcVar11 + -8) = 0x108f13;
      iVar5 = sanitizePlatformIndependentPath(_fname,dst);
      if (iVar5 == 0) {
        iVar5 = 0;
      }
      else if (*dst == '\0') {
        stat->filetype = PHYSFS_FILETYPE_DIRECTORY;
        stat->readonly = (uint)(writeDir == (DirHandle *)0x0);
        *(undefined8 *)((long)ppcVar11 + -8) = 1;
        iVar5 = (int)*(undefined8 *)((long)ppcVar11 + -8);
      }
      else {
        uVar13 = 0;
        uVar10 = 0;
        ppDVar12 = &searchPath;
        arcfname = (char *)stat;
        local_38 = pvVar9;
        while ((iVar5 = (int)uVar13, pvVar9 = local_38, (int)uVar10 == 0 &&
               (h = *ppDVar12, h != (DirHandle *)0x0))) {
          local_48 = dst;
          *(undefined8 *)((long)ppcVar11 + -8) = 0x108f5e;
          iVar5 = partOfMountPoint(h,dst);
          if (iVar5 == 0) {
            uVar10 = 0;
            *(undefined8 *)((long)ppcVar11 + -8) = 0x108f8c;
            iVar5 = verifyPath(h,&local_48,0);
            pcVar4 = arcfname;
            pcVar3 = local_48;
            if (iVar5 != 0) {
              pvVar9 = h->opaque;
              p_Var1 = h->funcs->stat;
              *(undefined8 *)((long)ppcVar11 + -8) = 0x108fa3;
              uVar6 = (*p_Var1)(pvVar9,pcVar3,(PHYSFS_Stat *)pcVar4);
              if (uVar6 == 0) {
                *(undefined8 *)((long)ppcVar11 + -8) = 0x108faf;
                PVar7 = currentErrorCode();
                uVar10 = 0;
                uVar13 = 0;
                if (PVar7 == PHYSFS_ERR_NOT_FOUND) goto LAB_00108fc2;
              }
              *(undefined8 *)((long)ppcVar11 + -8) = 1;
              uVar10 = *(ulong *)((long)ppcVar11 + -8);
              uVar13 = (ulong)uVar6;
            }
          }
          else {
            arcfname[0x20] = '\x01';
            arcfname[0x21] = '\0';
            arcfname[0x22] = '\0';
            arcfname[0x23] = '\0';
            arcfname[0x24] = '\x01';
            arcfname[0x25] = '\0';
            arcfname[0x26] = '\0';
            arcfname[0x27] = '\0';
            *(undefined8 *)((long)ppcVar11 + -8) = 1;
            uVar10 = *(ulong *)((long)ppcVar11 + -8);
            uVar13 = uVar10 & 0xffffffff;
          }
LAB_00108fc2:
          ppDVar12 = &h->next;
        }
      }
      *(undefined8 *)((long)ppcVar11 + -8) = 0x109016;
      __PHYSFS_platformReleaseMutex(stateLock);
      if (*(long *)((long)pvVar9 + -8) == 0) {
        return iVar5;
      }
      *(undefined8 *)((long)ppcVar11 + -8) = 0x10902e;
      (*__PHYSFS_AllocatorHooks.Free)((void *)((long)pvVar9 + -8));
      return iVar5;
    }
    *(undefined8 *)((long)ppcVar11 + -8) = 2;
    uVar2 = *(undefined8 *)((long)ppcVar11 + -8);
    *(undefined8 *)((long)ppcVar11 + -8) = 0x108fd3;
    PHYSFS_setErrorCode((PHYSFS_ErrorCode)uVar2);
    *(undefined8 *)((long)ppcVar11 + -8) = 0x108fdf;
    __PHYSFS_platformReleaseMutex(stateLock);
  }
  return 0;
}

Assistant:

int PHYSFS_stat(const char *_fname, PHYSFS_Stat *stat)
{
    int retval = 0;
    char *allocated_fname;
    char *fname;
    size_t len;

    BAIL_IF(!_fname, PHYSFS_ERR_INVALID_ARGUMENT, 0);
    BAIL_IF(!stat, PHYSFS_ERR_INVALID_ARGUMENT, 0);

    /* set some sane defaults... */
    stat->filesize = -1;
    stat->modtime = -1;
    stat->createtime = -1;
    stat->accesstime = -1;
    stat->filetype = PHYSFS_FILETYPE_OTHER;
    stat->readonly = 1;

    __PHYSFS_platformGrabMutex(stateLock);
    len = strlen(_fname) + longest_root + 1;
    allocated_fname = (char *) __PHYSFS_smallAlloc(len);
    BAIL_IF_MUTEX(!allocated_fname, PHYSFS_ERR_OUT_OF_MEMORY, stateLock, 0);
    fname = allocated_fname + longest_root;

    if (sanitizePlatformIndependentPath(_fname, fname))
    {
        if (*fname == '\0')
        {
            stat->filetype = PHYSFS_FILETYPE_DIRECTORY;
            stat->readonly = !writeDir; /* Writeable if we have a writeDir */
            retval = 1;
        } /* if */
        else
        {
            DirHandle *i;
            int exists = 0;
            for (i = searchPath; ((i != NULL) && (!exists)); i = i->next)
            {
                char *arcfname = fname;
                exists = partOfMountPoint(i, arcfname);
                if (exists)
                {
                    stat->filetype = PHYSFS_FILETYPE_DIRECTORY;
                    stat->readonly = 1;
                    retval = 1;
                } /* if */
                else if (verifyPath(i, &arcfname, 0))
                {
                    retval = i->funcs->stat(i->opaque, arcfname, stat);
                    if ((retval) || (currentErrorCode() != PHYSFS_ERR_NOT_FOUND))
                        exists = 1;
                } /* else if */
            } /* for */
        } /* else */
    } /* if */

    __PHYSFS_platformReleaseMutex(stateLock);
    __PHYSFS_smallFree(allocated_fname);

    return retval;
}